

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseAttributeType(xmlParserCtxtPtr ctxt,xmlEnumerationPtr *tree)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  
  if (ctxt->progressive == 0) {
    pxVar2 = ctxt->input;
    if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
       ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  xVar1 = *pxVar3;
  if (xVar1 == 'N') {
    if (pxVar3[1] != 'M') goto LAB_0015ee60;
    if (((((pxVar3[2] != 'T') || (pxVar3[3] != 'O')) || (pxVar3[4] != 'K')) ||
        ((pxVar3[5] != 'E' || (pxVar3[6] != 'N')))) || (pxVar3[7] != 'S')) {
      if (((pxVar3[2] != 'T') || (pxVar3[3] != 'O')) ||
         ((pxVar3[4] != 'K' || ((pxVar3[5] != 'E' || (pxVar3[6] != 'N')))))) goto LAB_0015ee60;
      pxVar2->cur = pxVar3 + 7;
      pxVar2->col = pxVar2->col + 7;
      iVar4 = 7;
      xVar1 = pxVar3[7];
      goto joined_r0x0015ee5c;
    }
    pxVar2->cur = pxVar3 + 8;
    pxVar2->col = pxVar2->col + 8;
    iVar4 = 8;
  }
  else {
    if (xVar1 != 'E') {
      if (xVar1 == 'I') {
        if (pxVar3[1] != 'D') goto LAB_0015ee60;
        if ((((pxVar3[2] == 'R') && (pxVar3[3] == 'E')) && (pxVar3[4] == 'F')) && (pxVar3[5] == 'S')
           ) {
          pxVar2->cur = pxVar3 + 6;
          pxVar2->col = pxVar2->col + 6;
          iVar4 = 4;
          goto LAB_0015ed9b;
        }
        if (((pxVar3[2] != 'R') || (pxVar3[3] != 'E')) || (pxVar3[4] != 'F')) {
          pxVar2->cur = pxVar3 + 2;
          pxVar2->col = pxVar2->col + 2;
          iVar4 = 2;
          xVar1 = pxVar3[2];
          goto joined_r0x0015ee5c;
        }
        pxVar2->cur = pxVar3 + 5;
        pxVar2->col = pxVar2->col + 5;
        iVar4 = 3;
      }
      else {
        if (((xVar1 != 'C') || (pxVar3[1] != 'D')) ||
           ((pxVar3[2] != 'A' || ((pxVar3[3] != 'T' || (pxVar3[4] != 'A')))))) {
LAB_0015ee60:
          iVar4 = xmlParseEnumeratedType(ctxt,tree);
          return iVar4;
        }
        pxVar2->cur = pxVar3 + 5;
        pxVar2->col = pxVar2->col + 5;
        iVar4 = 1;
      }
      xVar1 = pxVar3[5];
      goto joined_r0x0015ee5c;
    }
    if (pxVar3[1] != 'N') goto LAB_0015ee60;
    if ((((pxVar3[2] == 'T') && (pxVar3[3] == 'I')) && (pxVar3[4] == 'T')) && (pxVar3[5] == 'Y')) {
      pxVar2->cur = pxVar3 + 6;
      pxVar2->col = pxVar2->col + 6;
      iVar4 = 5;
LAB_0015ed9b:
      xVar1 = pxVar3[6];
      goto joined_r0x0015ee5c;
    }
    if (((pxVar3[2] != 'T') || (pxVar3[3] != 'I')) ||
       (((pxVar3[4] != 'T' || ((pxVar3[5] != 'I' || (pxVar3[6] != 'E')))) || (pxVar3[7] != 'S'))))
    goto LAB_0015ee60;
    pxVar2->cur = pxVar3 + 8;
    pxVar2->col = pxVar2->col + 8;
    iVar4 = 6;
  }
  xVar1 = pxVar3[8];
joined_r0x0015ee5c:
  if (xVar1 == '\0') {
    xmlParserInputGrow(pxVar2,0xfa);
  }
  return iVar4;
}

Assistant:

int
xmlParseAttributeType(xmlParserCtxtPtr ctxt, xmlEnumerationPtr *tree) {

    DEBUG_ENTER(("xmlParseAttributeType(%s, %p);\n", dbgCtxt(ctxt), tree));

    SHRINK;
    if (CMP5(CUR_PTR, 'C', 'D', 'A', 'T', 'A')) {
	SKIP(5);
	RETURN_INT(XML_ATTRIBUTE_CDATA);
     } else if (CMP6(CUR_PTR, 'I', 'D', 'R', 'E', 'F', 'S')) {
	SKIP(6);
	RETURN_INT(XML_ATTRIBUTE_IDREFS);
     } else if (CMP5(CUR_PTR, 'I', 'D', 'R', 'E', 'F')) {
	SKIP(5);
	RETURN_INT(XML_ATTRIBUTE_IDREF);
     } else if ((RAW == 'I') && (NXT(1) == 'D')) {
        SKIP(2);
	RETURN_INT(XML_ATTRIBUTE_ID);
     } else if (CMP6(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'Y')) {
	SKIP(6);
	RETURN_INT(XML_ATTRIBUTE_ENTITY);
     } else if (CMP8(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'I', 'E', 'S')) {
	SKIP(8);
	RETURN_INT(XML_ATTRIBUTE_ENTITIES);
     } else if (CMP8(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N', 'S')) {
	SKIP(8);
	RETURN_INT(XML_ATTRIBUTE_NMTOKENS);
     } else if (CMP7(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N')) {
	SKIP(7);
	RETURN_INT(XML_ATTRIBUTE_NMTOKEN);
     }
     RETURN_INT(xmlParseEnumeratedType(ctxt, tree));
}